

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O2

void icu_63::util_append64(UnicodeString *result,int64_t n)

{
  uint32_t textLength;
  UnicodeString temp;
  UChar buffer [256];
  
  textLength = util64_tou(n,buffer,0x200,10,'\0');
  UnicodeString::UnicodeString(&temp,buffer,textLength);
  UnicodeString::append(result,&temp);
  UnicodeString::~UnicodeString(&temp);
  return;
}

Assistant:

static void util_append64(UnicodeString& result, int64_t n)
{
    UChar buffer[256];
    int32_t len = util64_tou(n, buffer, sizeof(buffer));
    UnicodeString temp(buffer, len);
    result.append(temp);
}